

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Choice.cxx
# Opt level: O3

int __thiscall Fl_Choice::handle(Fl_Choice *this,int e)

{
  bool bVar1;
  int iVar2;
  Fl_Color FVar3;
  Fl_Menu_Item *pFVar4;
  
  pFVar4 = (this->super_Fl_Menu_).menu_;
  iVar2 = 0;
  if (pFVar4 == (Fl_Menu_Item *)0x0) {
    return 0;
  }
  if (pFVar4->text == (char *)0x0) {
    return 0;
  }
  switch(e) {
  default:
    goto switchD_001aa55d_caseD_2;
  case 3:
  case 4:
    break;
  case 6:
  case 7:
    bVar1 = Fl::option(OPTION_VISIBLE_FOCUS);
    if (!bVar1) {
      return 0;
    }
    Fl_Widget::redraw((Fl_Widget *)this);
    break;
  case 8:
    if (Fl::e_keysym != 0x20) {
      return 0;
    }
    if ((Fl::e_state._2_1_ & 0x4d) != 0) {
      return 0;
    }
  case 1:
    bVar1 = Fl::option(OPTION_VISIBLE_FOCUS);
    if (bVar1) {
      Fl::focus((Fl_Widget *)this);
    }
LAB_001aa5c7:
    if ((Fl::scheme_ == (char *)0x0) &&
       (FVar3 = fl_contrast((this->super_Fl_Menu_).textcolor_,7),
       FVar3 == (this->super_Fl_Menu_).textcolor_)) {
      FVar3 = (this->super_Fl_Menu_).super_Fl_Widget.color_;
      (this->super_Fl_Menu_).super_Fl_Widget.color_ = 7;
      pFVar4 = Fl_Menu_Item::pulldown
                         ((this->super_Fl_Menu_).menu_,(this->super_Fl_Menu_).super_Fl_Widget.x_,
                          (this->super_Fl_Menu_).super_Fl_Widget.y_,
                          (this->super_Fl_Menu_).super_Fl_Widget.w_,
                          (this->super_Fl_Menu_).super_Fl_Widget.h_,(this->super_Fl_Menu_).value_,
                          &this->super_Fl_Menu_,(Fl_Menu_Item *)0x0,0);
      (this->super_Fl_Menu_).super_Fl_Widget.color_ = FVar3;
    }
    else {
      pFVar4 = Fl_Menu_Item::pulldown
                         ((this->super_Fl_Menu_).menu_,(this->super_Fl_Menu_).super_Fl_Widget.x_,
                          (this->super_Fl_Menu_).super_Fl_Widget.y_,
                          (this->super_Fl_Menu_).super_Fl_Widget.w_,
                          (this->super_Fl_Menu_).super_Fl_Widget.h_,(this->super_Fl_Menu_).value_,
                          &this->super_Fl_Menu_,(Fl_Menu_Item *)0x0,0);
    }
    if ((pFVar4 != (Fl_Menu_Item *)0x0) && ((pFVar4->flags & 0x60) == 0)) {
LAB_001aa674:
      if (pFVar4 != (this->super_Fl_Menu_).value_) {
        Fl_Widget::redraw((Fl_Widget *)this);
      }
      Fl_Menu_::picked(&this->super_Fl_Menu_,pFVar4);
    }
    break;
  case 0xc:
    iVar2 = Fl_Widget::test_shortcut((Fl_Widget *)this);
    if (iVar2 != 0) goto LAB_001aa5c7;
    pFVar4 = Fl_Menu_Item::test_shortcut((this->super_Fl_Menu_).menu_);
    if (pFVar4 == (Fl_Menu_Item *)0x0) {
      return 0;
    }
    goto LAB_001aa674;
  }
  iVar2 = 1;
switchD_001aa55d_caseD_2:
  return iVar2;
}

Assistant:

int Fl_Choice::handle(int e) {
  if (!menu() || !menu()->text) return 0;
  const Fl_Menu_Item* v;
  switch (e) {
  case FL_ENTER:
  case FL_LEAVE:
    return 1;

  case FL_KEYBOARD:
    if (Fl::event_key() != ' ' ||
        (Fl::event_state() & (FL_SHIFT | FL_CTRL | FL_ALT | FL_META))) return 0;
  case FL_PUSH:
    if (Fl::visible_focus()) Fl::focus(this);
  J1:
    if (Fl::scheme()
	|| fl_contrast(textcolor(), FL_BACKGROUND2_COLOR) != textcolor()) {
      v = menu()->pulldown(x(), y(), w(), h(), mvalue(), this);
    } else {
      // In order to preserve the old look-n-feel of "white" menus,
      // temporarily override the color() of this widget...
      Fl_Color c = color();
      color(FL_BACKGROUND2_COLOR);
      v = menu()->pulldown(x(), y(), w(), h(), mvalue(), this);
      color(c);
    }
    if (!v || v->submenu()) return 1;
    if (v != mvalue()) redraw();
    picked(v);
    return 1;
  case FL_SHORTCUT:
    if (Fl_Widget::test_shortcut()) goto J1;
    v = menu()->test_shortcut();
    if (!v) return 0;
    if (v != mvalue()) redraw();
    picked(v);
    return 1;
  case FL_FOCUS:
  case FL_UNFOCUS:
    if (Fl::visible_focus()) {
      redraw();
      return 1;
    } else return 0;
  default:
    return 0;
  }
}